

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O1

int decoder_get_length(ndn_decoder_t *decoder,uint32_t *length)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  
  puVar3 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar3[uVar2];
  uVar5 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar4 = 1;
  }
  else {
    uVar5 = decoder->input_size - uVar2;
    if (uVar5 < 3 || bVar1 != 0xfd) {
      if (uVar5 < 5 || bVar1 != 0xfe) {
        return -0xe;
      }
      uVar5 = (uint)puVar3[uVar2 + 4] |
              (uint)puVar3[uVar2 + 3] << 8 |
              (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      iVar4 = 5;
    }
    else {
      uVar5 = (uint)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      iVar4 = 3;
    }
  }
  *length = uVar5;
  decoder->offset = decoder->offset + iVar4;
  return 0;
}

Assistant:

static inline int
decoder_get_length(ndn_decoder_t* decoder, uint32_t* length)
{
  return decoder_get_var(decoder, length);
}